

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper_p.h
# Opt level: O2

void QRadialFetchSimd<QSimdSse2>::fetch
               (uint *buffer,uint *end,Operator *op,QSpanData *data,qreal det,qreal delta_det,
               qreal delta_delta_det,qreal b,qreal delta_b)

{
  Spread SVar1;
  short sVar2;
  undefined1 auVar3 [16];
  int i;
  uint uVar4;
  long lVar5;
  long in_FS_OFFSET;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 in_XMM10 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  short sVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  undefined1 in_XMM11 [16];
  float fVar27;
  short sVar28;
  Vect_buffer_f b_vec;
  Vect_buffer_f delta_det4_vec;
  Vect_buffer_f det_vec;
  undefined1 local_58 [16];
  uint local_48 [4];
  float local_38 [12];
  long local_8;
  
  auVar19 = _DAT_0060d780;
  auVar20 = _DAT_0060d770;
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_38[8] = -NAN;
  local_38[9] = -NAN;
  local_38[10] = -NAN;
  local_38[0xb] = -NAN;
  local_38[4] = -NAN;
  local_38[5] = -NAN;
  local_38[6] = -NAN;
  local_38[7] = -NAN;
  local_38[0] = -NAN;
  local_38[1] = -NAN;
  local_38[2] = -NAN;
  local_38[3] = -NAN;
  for (lVar5 = 0; lVar5 != 4; lVar5 = lVar5 + 1) {
    local_38[lVar5 + 8] = (float)det;
    local_38[lVar5 + 4] = (float)(delta_det * 4.0);
    local_38[lVar5] = (float)b;
    det = det + delta_det;
    delta_det = delta_det + delta_delta_det;
    b = b + delta_b;
  }
  fVar6 = (float)(delta_delta_det * 16.0);
  fVar7 = (float)(delta_delta_det * 6.0);
  fVar8 = (float)(delta_b * 4.0);
  fVar9 = (float)*(double *)((long)&data->field_23 + 0x30);
  fVar10 = (float)(op->field_16).linear.l;
  uVar4 = -((op->field_16).radial.extended ^ 1);
  SVar1 = (data->field_23).gradient.spread;
  fVar11 = (float)DAT_0060d770;
  fVar12 = DAT_0060d770._4_4_;
  fVar13 = DAT_0060d770._8_4_;
  fVar14 = DAT_0060d770._12_4_;
  fVar15 = (float)DAT_005c6bc0;
  fVar17 = DAT_005c6bc0._8_4_;
  fVar16 = DAT_005c6bc0._4_4_;
  fVar18 = DAT_005c6bc0._12_4_;
  if (SVar1 == RepeatSpread) {
    for (; buffer < end; buffer = buffer + 4) {
      auVar20._4_4_ = local_38[9];
      auVar20._0_4_ = local_38[8];
      auVar20._8_4_ = local_38[10];
      auVar20._12_4_ = local_38[0xb];
      auVar20 = maxps(ZEXT816(0),auVar20);
      auVar20 = sqrtps(auVar20,auVar20);
      fVar24 = auVar20._0_4_ - local_38[0];
      fVar25 = auVar20._4_4_ - local_38[1];
      fVar26 = auVar20._8_4_ - local_38[2];
      fVar27 = auVar20._12_4_ - local_38[3];
      local_48[0] = -(uint)(0.0 < fVar10 * fVar24 + fVar9 && 0.0 < local_38[8]);
      local_48[1] = -(uint)(0.0 < fVar10 * fVar25 + fVar9 && 0.0 < local_38[9]);
      local_48[2] = -(uint)(0.0 < fVar10 * fVar26 + fVar9 && 0.0 < local_38[10]);
      local_48[3] = -(uint)(0.0 < fVar10 * fVar27 + fVar9 && 0.0 < local_38[0xb]);
      local_58._0_8_ =
           CONCAT44((int)(fVar25 * fVar12 + fVar16),(int)(fVar24 * fVar11 + fVar15)) & 0x3ff000003ff
      ;
      local_58._8_4_ = (int)(fVar26 * fVar13 + fVar17) & 0x3ff;
      local_58._12_4_ = (int)(fVar27 * fVar14 + fVar18) & 0x3ff;
      local_38[8] = local_38[8] + local_38[4] + fVar7;
      local_38[9] = local_38[9] + local_38[5] + fVar7;
      local_38[10] = local_38[10] + local_38[6] + fVar7;
      local_38[0xb] = local_38[0xb] + local_38[7] + fVar7;
      local_38[4] = local_38[4] + fVar6;
      local_38[5] = local_38[5] + fVar6;
      local_38[6] = local_38[6] + fVar6;
      local_38[7] = local_38[7] + fVar6;
      local_38[0] = local_38[0] + fVar8;
      local_38[1] = local_38[1] + fVar8;
      local_38[2] = local_38[2] + fVar8;
      local_38[3] = local_38[3] + fVar8;
      for (lVar5 = 0; lVar5 != 0x10; lVar5 = lVar5 + 4) {
        *(uint *)((long)buffer + lVar5) =
             (*(uint *)((long)local_48 + lVar5) | uVar4) &
             (data->field_23).gradient.colorTable32[*(int *)(local_58 + lVar5)];
      }
    }
  }
  else if (SVar1 == ReflectSpread) {
    for (; buffer < end; buffer = buffer + 4) {
      auVar3._4_4_ = local_38[9];
      auVar3._0_4_ = local_38[8];
      auVar3._8_4_ = local_38[10];
      auVar3._12_4_ = local_38[0xb];
      auVar20 = maxps(ZEXT816(0),auVar3);
      auVar20 = sqrtps(in_XMM11,auVar20);
      fVar24 = auVar20._0_4_ - local_38[0];
      fVar25 = auVar20._4_4_ - local_38[1];
      fVar26 = auVar20._8_4_ - local_38[2];
      fVar27 = auVar20._12_4_ - local_38[3];
      local_48[0] = -(uint)(0.0 < fVar10 * fVar24 + fVar9 && 0.0 < local_38[8]);
      local_48[1] = -(uint)(0.0 < fVar10 * fVar25 + fVar9 && 0.0 < local_38[9]);
      local_48[2] = -(uint)(0.0 < fVar10 * fVar26 + fVar9 && 0.0 < local_38[10]);
      local_48[3] = -(uint)(0.0 < fVar10 * fVar27 + fVar9 && 0.0 < local_38[0xb]);
      auVar21._0_4_ = (int)(fVar24 * fVar11 + fVar15);
      auVar21._4_4_ = (int)(fVar25 * fVar12 + fVar16);
      auVar21._8_4_ = (int)(fVar26 * fVar13 + fVar17);
      auVar21._12_4_ = (int)(fVar27 * fVar14 + fVar18);
      auVar21 = auVar21 & auVar19;
      auVar20 = auVar21 ^ auVar19;
      sVar2 = auVar21._0_2_;
      sVar23 = auVar20._0_2_;
      in_XMM11._0_2_ = (ushort)(sVar2 < sVar23) * sVar2 | (ushort)(sVar2 >= sVar23) * sVar23;
      sVar2 = auVar21._2_2_;
      sVar23 = auVar20._2_2_;
      in_XMM11._2_2_ = (ushort)(sVar2 < sVar23) * sVar2 | (ushort)(sVar2 >= sVar23) * sVar23;
      sVar2 = auVar21._4_2_;
      sVar23 = auVar20._4_2_;
      in_XMM11._4_2_ = (ushort)(sVar2 < sVar23) * sVar2 | (ushort)(sVar2 >= sVar23) * sVar23;
      sVar2 = auVar21._6_2_;
      sVar23 = auVar20._6_2_;
      in_XMM11._6_2_ = (ushort)(sVar2 < sVar23) * sVar2 | (ushort)(sVar2 >= sVar23) * sVar23;
      sVar2 = auVar21._8_2_;
      sVar23 = auVar20._8_2_;
      in_XMM11._8_2_ = (ushort)(sVar2 < sVar23) * sVar2 | (ushort)(sVar2 >= sVar23) * sVar23;
      sVar2 = auVar21._10_2_;
      sVar23 = auVar20._10_2_;
      in_XMM11._10_2_ = (ushort)(sVar2 < sVar23) * sVar2 | (ushort)(sVar2 >= sVar23) * sVar23;
      sVar2 = auVar21._12_2_;
      sVar23 = auVar20._12_2_;
      sVar28 = auVar20._14_2_;
      in_XMM11._12_2_ = (ushort)(sVar2 < sVar23) * sVar2 | (ushort)(sVar2 >= sVar23) * sVar23;
      sVar2 = auVar21._14_2_;
      in_XMM11._14_2_ = (ushort)(sVar2 < sVar28) * sVar2 | (ushort)(sVar2 >= sVar28) * sVar28;
      local_58 = in_XMM11;
      local_38[8] = local_38[8] + local_38[4] + fVar7;
      local_38[9] = local_38[9] + local_38[5] + fVar7;
      local_38[10] = local_38[10] + local_38[6] + fVar7;
      local_38[0xb] = local_38[0xb] + local_38[7] + fVar7;
      local_38[4] = local_38[4] + fVar6;
      local_38[5] = local_38[5] + fVar6;
      local_38[6] = local_38[6] + fVar6;
      local_38[7] = local_38[7] + fVar6;
      local_38[0] = local_38[0] + fVar8;
      local_38[1] = local_38[1] + fVar8;
      local_38[2] = local_38[2] + fVar8;
      local_38[3] = local_38[3] + fVar8;
      for (lVar5 = 0; lVar5 != 0x10; lVar5 = lVar5 + 4) {
        *(uint *)((long)buffer + lVar5) =
             (*(uint *)((long)local_48 + lVar5) | uVar4) &
             (data->field_23).gradient.colorTable32[*(int *)(local_58 + lVar5)];
      }
    }
  }
  else {
    for (; buffer < end; buffer = buffer + 4) {
      auVar19._4_4_ = local_38[9];
      auVar19._0_4_ = local_38[8];
      auVar19._8_4_ = local_38[10];
      auVar19._12_4_ = local_38[0xb];
      auVar19 = maxps(ZEXT816(0),auVar19);
      auVar19 = sqrtps(in_XMM10,auVar19);
      fVar24 = auVar19._0_4_ - local_38[0];
      fVar25 = auVar19._4_4_ - local_38[1];
      fVar26 = auVar19._8_4_ - local_38[2];
      fVar27 = auVar19._12_4_ - local_38[3];
      auVar22._0_4_ = fVar24 * fVar11 + fVar15;
      auVar22._4_4_ = fVar25 * fVar12 + fVar16;
      auVar22._8_4_ = fVar26 * fVar13 + fVar17;
      auVar22._12_4_ = fVar27 * fVar14 + fVar18;
      local_48[0] = -(uint)(0.0 < fVar10 * fVar24 + fVar9 && 0.0 < local_38[8]);
      local_48[1] = -(uint)(0.0 < fVar10 * fVar25 + fVar9 && 0.0 < local_38[9]);
      local_48[2] = -(uint)(0.0 < fVar10 * fVar26 + fVar9 && 0.0 < local_38[10]);
      local_48[3] = -(uint)(0.0 < fVar10 * fVar27 + fVar9 && 0.0 < local_38[0xb]);
      auVar19 = maxps(ZEXT816(0),auVar22);
      in_XMM10 = minps(auVar20,auVar19);
      local_58._4_4_ = (int)in_XMM10._4_4_;
      local_58._0_4_ = (int)in_XMM10._0_4_;
      local_58._8_4_ = (int)in_XMM10._8_4_;
      local_58._12_4_ = (int)in_XMM10._12_4_;
      local_38[8] = local_38[8] + local_38[4] + fVar7;
      local_38[9] = local_38[9] + local_38[5] + fVar7;
      local_38[10] = local_38[10] + local_38[6] + fVar7;
      local_38[0xb] = local_38[0xb] + local_38[7] + fVar7;
      local_38[4] = local_38[4] + fVar6;
      local_38[5] = local_38[5] + fVar6;
      local_38[6] = local_38[6] + fVar6;
      local_38[7] = local_38[7] + fVar6;
      local_38[0] = local_38[0] + fVar8;
      local_38[1] = local_38[1] + fVar8;
      local_38[2] = local_38[2] + fVar8;
      local_38[3] = local_38[3] + fVar8;
      for (lVar5 = 0; lVar5 != 0x10; lVar5 = lVar5 + 4) {
        *(uint *)((long)buffer + lVar5) =
             (*(uint *)((long)local_48 + lVar5) | uVar4) &
             (data->field_23).gradient.colorTable32[*(int *)(local_58 + lVar5)];
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void fetch(uint *buffer, uint *end, const Operator *op, const QSpanData *data, qreal det,
                      qreal delta_det, qreal delta_delta_det, qreal b, qreal delta_b)
    {
        typename Simd::Vect_buffer_f det_vec;
        typename Simd::Vect_buffer_f delta_det4_vec;
        typename Simd::Vect_buffer_f b_vec;

        for (int i = 0; i < 4; ++i) {
            det_vec.f[i] = det;
            delta_det4_vec.f[i] = 4 * delta_det;
            b_vec.f[i] = b;

            det += delta_det;
            delta_det += delta_delta_det;
            b += delta_b;
        }

        const typename Simd::Float32x4 v_delta_delta_det16 = Simd::v_dup(16 * delta_delta_det);
        const typename Simd::Float32x4 v_delta_delta_det6 = Simd::v_dup(6 * delta_delta_det);
        const typename Simd::Float32x4 v_delta_b4 = Simd::v_dup(4 * delta_b);

        const typename Simd::Float32x4 v_r0 = Simd::v_dup(data->gradient.radial.focal.radius);
        const typename Simd::Float32x4 v_dr = Simd::v_dup(op->radial.dr);

#if defined(__ARM_NEON__)
        // NEON doesn't have SIMD sqrt, but uses rsqrt instead that can't be taken of 0.
        const typename Simd::Float32x4 v_min = Simd::v_dup(std::numeric_limits<float>::epsilon());
#else
        const typename Simd::Float32x4 v_min = Simd::v_dup(0.0f);
#endif
        const typename Simd::Float32x4 v_max = Simd::v_dup(float(GRADIENT_STOPTABLE_SIZE-1));
        const typename Simd::Float32x4 v_half = Simd::v_dup(0.5f);

        const typename Simd::Int32x4 v_repeat_mask = Simd::v_dup(~(uint(0xffffff) << GRADIENT_STOPTABLE_SIZE_SHIFT));
        const typename Simd::Int32x4 v_reflect_mask = Simd::v_dup(~(uint(0xffffff) << (GRADIENT_STOPTABLE_SIZE_SHIFT+1)));

        const typename Simd::Int32x4 v_reflect_limit = Simd::v_dup(2 * GRADIENT_STOPTABLE_SIZE - 1);

        const int extended_mask = op->radial.extended ? 0x0 : ~0x0;

#define FETCH_RADIAL_LOOP_PROLOGUE \
        while (buffer < end) { \
            typename Simd::Vect_buffer_i v_buffer_mask; \
            v_buffer_mask.v = Simd::v_greaterOrEqual(det_vec.v, v_min); \
            const typename Simd::Float32x4 v_index_local = Simd::v_sub(Simd::v_sqrt(Simd::v_max(v_min, det_vec.v)), b_vec.v); \
            const typename Simd::Float32x4 v_index = Simd::v_add(Simd::v_mul(v_index_local, v_max), v_half); \
            v_buffer_mask.v = Simd::v_and(v_buffer_mask.v, Simd::v_greaterOrEqual(Simd::v_add(v_r0, Simd::v_mul(v_dr, v_index_local)), v_min)); \
            typename Simd::Vect_buffer_i index_vec;
#define FETCH_RADIAL_LOOP_CLAMP_REPEAT \
            index_vec.v = Simd::v_and(v_repeat_mask, Simd::v_toInt(v_index));
#define FETCH_RADIAL_LOOP_CLAMP_REFLECT \
            const typename Simd::Int32x4 v_index_i = Simd::v_and(v_reflect_mask, Simd::v_toInt(v_index)); \
            const typename Simd::Int32x4 v_index_i_inv = Simd::v_sub(v_reflect_limit, v_index_i); \
            index_vec.v = Simd::v_min_16(v_index_i, v_index_i_inv);
#define FETCH_RADIAL_LOOP_CLAMP_PAD \
            index_vec.v = Simd::v_toInt(Simd::v_min(v_max, Simd::v_max(v_min, v_index)));
#define FETCH_RADIAL_LOOP_EPILOGUE \
            det_vec.v = Simd::v_add(Simd::v_add(det_vec.v, delta_det4_vec.v), v_delta_delta_det6); \
            delta_det4_vec.v = Simd::v_add(delta_det4_vec.v, v_delta_delta_det16); \
            b_vec.v = Simd::v_add(b_vec.v, v_delta_b4); \
            for (int i = 0; i < 4; ++i) \
                *buffer++ = (extended_mask | v_buffer_mask.i[i]) & data->gradient.colorTable32[index_vec.i[i]]; \
        }

#define FETCH_RADIAL_LOOP(FETCH_RADIAL_LOOP_CLAMP) \
        FETCH_RADIAL_LOOP_PROLOGUE \
        FETCH_RADIAL_LOOP_CLAMP \
        FETCH_RADIAL_LOOP_EPILOGUE

        switch (data->gradient.spread) {
        case QGradient::RepeatSpread:
            FETCH_RADIAL_LOOP(FETCH_RADIAL_LOOP_CLAMP_REPEAT)
            break;
        case QGradient::ReflectSpread:
            FETCH_RADIAL_LOOP(FETCH_RADIAL_LOOP_CLAMP_REFLECT)
            break;
        case QGradient::PadSpread:
            FETCH_RADIAL_LOOP(FETCH_RADIAL_LOOP_CLAMP_PAD)
            break;
        default:
            Q_UNREACHABLE();
        }
    }